

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deep.cpp
# Opt level: O0

void anon_unknown.dwarf_23ddf::err_cb(exr_const_context_t f,int code,char *msg)

{
  ostream *poVar1;
  char *in_RDX;
  int in_ESI;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"err_cb ERROR ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_ESI);
  poVar1 = std::operator<<(poVar1,": ");
  poVar1 = std::operator<<(poVar1,in_RDX);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

static void
err_cb (exr_const_context_t f, int code, const char* msg)
{
    std::cerr << "err_cb ERROR " << code << ": " << msg << std::endl;
}